

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O0

void __thiscall ezexample::mini_setup_example(ezexample *this)

{
  float fVar1;
  long lVar2;
  bool bVar3;
  reference pbVar4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  size_t sVar5;
  char *pcVar6;
  long in_RDI;
  undefined4 uVar7;
  iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_10 [2];
  
  *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x68a8) = 0;
  uVar7 = (**(code **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x358))
                    (*(long *)(in_RDI + 0x18) + 0x6828);
  *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x6870) = uVar7;
  *(long *)(*(long *)(in_RDI + 0x18) + 0x68a0) =
       *(long *)(*(long *)(in_RDI + 0x18) + 0x68a0) - *(long *)(in_RDI + 0x48);
  *(float *)(*(long *)(in_RDI + 0x18) + 0x68b4) =
       *(float *)(*(long *)(in_RDI + 0x18) + 0x68b4) - *(float *)(in_RDI + 0x50);
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined4 *)(in_RDI + 0x50) = 0;
  local_10[0]._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  while( true ) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end(in_stack_ffffffffffffffa8);
    bVar3 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar3) break;
    in_stack_ffffffffffffffa8 =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(*(long *)(in_RDI + 0x18) + 0x20);
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(local_10);
    std::__cxx11::string::operator[]((ulong)pbVar4);
    this_00 = (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)features::size((features *)0x11c956);
    in_stack_ffffffffffffffb0 =
         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(*(long *)(in_RDI + 0x18) + 0x20);
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(local_10);
    std::__cxx11::string::operator[]((ulong)pbVar4);
    sVar5 = features::size((features *)0x11c99d);
    *(size_t *)(in_RDI + 0x48) = (long)this_00 * sVar5 + *(long *)(in_RDI + 0x48);
    lVar2 = *(long *)(in_RDI + 0x18);
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(local_10);
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)pbVar4);
    fVar1 = *(float *)(lVar2 + (long)(int)*pcVar6 * 0x68 + 0x80);
    lVar2 = *(long *)(in_RDI + 0x18);
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(local_10);
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)pbVar4);
    *(float *)(in_RDI + 0x50) =
         fVar1 * *(float *)(lVar2 + (long)(int)*pcVar6 * 0x68 + 0x80) + *(float *)(in_RDI + 0x50);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(this_00,(int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  }
  *(long *)(*(long *)(in_RDI + 0x18) + 0x68a0) =
       *(long *)(in_RDI + 0x48) + *(long *)(*(long *)(in_RDI + 0x18) + 0x68a0);
  *(float *)(*(long *)(in_RDI + 0x18) + 0x68b4) =
       *(float *)(in_RDI + 0x50) + *(float *)(*(long *)(in_RDI + 0x18) + 0x68b4);
  return;
}

Assistant:

void mini_setup_example()
  {
    ec->partial_prediction = 0.;
    ec->weight = vw_par_ref->p->lp.get_weight(&ec->l);

    ec->num_features -= quadratic_features_num;
    ec->total_sum_feat_sq -= quadratic_features_sqr;

    quadratic_features_num = 0;
    quadratic_features_sqr = 0.;

    for (std::vector<std::string>::iterator i = vw_ref->pairs.begin(); i != vw_ref->pairs.end(); i++)
    {
      quadratic_features_num += ec->feature_space[(int)(*i)[0]].size() * ec->feature_space[(int)(*i)[1]].size();
      quadratic_features_sqr +=
          ec->feature_space[(int)(*i)[0]].sum_feat_sq * ec->feature_space[(int)(*i)[1]].sum_feat_sq;
    }
    ec->num_features += quadratic_features_num;
    ec->total_sum_feat_sq += quadratic_features_sqr;
  }